

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

int pcap_compile_nopcap(int snaplen_arg,int linktype_arg,bpf_program *program,char *buf,int optimize
                       ,bpf_u_int32 mask)

{
  int iVar1;
  pcap_t *p;
  
  p = pcap_open_dead(linktype_arg,snaplen_arg);
  if (p == (pcap_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = pcap_compile(p,program,buf,optimize,mask);
    pcap_close(p);
  }
  return iVar1;
}

Assistant:

int
pcap_compile_nopcap(int snaplen_arg, int linktype_arg,
		    struct bpf_program *program,
	     const char *buf, int optimize, bpf_u_int32 mask)
{
	pcap_t *p;
	int ret;

	p = pcap_open_dead(linktype_arg, snaplen_arg);
	if (p == NULL)
		return (-1);
	ret = pcap_compile(p, program, buf, optimize, mask);
	pcap_close(p);
	return (ret);
}